

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

void __thiscall
tchecker::clockbounds::df_solver_t::updateU
          (df_solver_t *this,clock_id_t i,clock_id_t j,ineq_cmp_t cmp,integer_t value)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  db_t bound;
  db_t local_1c;
  
  uVar2 = (ulong)i;
  if (this->_dim <= uVar2) {
    __assert_fail("i < _dim",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/clockbounds/solver.cc"
                  ,0xf0,
                  "void tchecker::clockbounds::df_solver_t::updateU(tchecker::clock_id_t, tchecker::clock_id_t, tchecker::ineq_cmp_t, tchecker::integer_t)"
                 );
  }
  uVar3 = (ulong)j;
  if (uVar3 < this->_dim) {
    local_1c = tchecker::dbm::db(cmp,value);
    bVar1 = tchecker::dbm::operator<(&local_1c,this->_U + this->_dim * uVar2 + uVar3);
    if (bVar1) {
      this->_U[uVar2 * this->_dim + uVar3] = local_1c;
      this->_updated_U = true;
    }
    return;
  }
  __assert_fail("j < _dim",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/clockbounds/solver.cc"
                ,0xf1,
                "void tchecker::clockbounds::df_solver_t::updateU(tchecker::clock_id_t, tchecker::clock_id_t, tchecker::ineq_cmp_t, tchecker::integer_t)"
               );
}

Assistant:

void df_solver_t::updateU(tchecker::clock_id_t i, tchecker::clock_id_t j, tchecker::ineq_cmp_t cmp, tchecker::integer_t value)
{
  assert(i < _dim);
  assert(j < _dim);
  tchecker::dbm::db_t bound = tchecker::dbm::db(cmp, value);
  if (bound < _U[i * _dim + j]) {
    _U[i * _dim + j] = bound;
    _updated_U = true;
  }
}